

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_iq4_nl(block_iq4_nl *x,float *y,int64_t k)

{
  float fVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  uint8_t *puVar5;
  int j;
  long lVar6;
  
  lVar4 = 0;
  lVar3 = k / 0x20;
  if (k / 0x20 < 1) {
    lVar3 = lVar4;
  }
  puVar5 = x->qs;
  for (; lVar4 != lVar3; lVar4 = lVar4 + 1) {
    fVar1 = ggml_table_f32_f16[x[lVar4].d];
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      cVar2 = kvalues_iq4nl[puVar5[lVar6] >> 4];
      y[lVar6] = (float)(int)kvalues_iq4nl[puVar5[lVar6] & 0xf] * fVar1;
      y[lVar6 + 0x10] = (float)(int)cVar2 * fVar1;
    }
    y = y + 0x20;
    puVar5 = puVar5 + 0x12;
  }
  return;
}

Assistant:

void dequantize_row_iq4_nl(const block_iq4_nl * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK4_NL == 0);
    const int64_t nb = k / QK4_NL;

    for (int i = 0; i < nb; i++) {

        const uint8_t * qs = x[i].qs;

        const float d = GGML_FP16_TO_FP32(x[i].d);
        for (int j = 0; j < QK4_NL/2; ++j) {
            y[j+       0] = d * kvalues_iq4nl[qs[j] & 0xf];
            y[j+QK4_NL/2] = d * kvalues_iq4nl[qs[j] >>  4];
        }
        y  += QK4_NL;
        qs += QK4_NL/2;
    }
}